

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowViewportThumbnails(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImFont *font;
  char *text;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  ImU32 IVar9;
  ulong uVar10;
  char *text_end;
  int n;
  long lVar11;
  ImGuiWindow *this;
  ImGuiViewportP *pIVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar18;
  undefined1 auVar17 [16];
  float fVar19;
  float fVar21;
  undefined1 auVar20 [16];
  ImRect IVar22;
  ImRect thumb_r_scaled;
  ImRect local_f8;
  ImRect local_e8;
  undefined1 local_d8 [16];
  ImGuiContext *local_c8;
  ImDrawList *local_c0;
  long local_b8;
  ImGuiViewportP *local_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  pIVar8 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  _local_a8 = ZEXT816(0);
  for (lVar11 = 0; uVar10 = (ulong)(pIVar8->Viewports).Size, lVar11 < (long)uVar10;
      lVar11 = lVar11 + 1) {
    IVar22 = ImGuiViewportP::GetRect((pIVar8->Viewports).Data[lVar11]);
    uVar15 = -(uint)(IVar22.Min.y < fStack_a0);
    uVar16 = -(uint)(IVar22.Min.x < fStack_9c);
    uVar13 = -(uint)((float)local_a8._0_4_ < IVar22.Max.y);
    uVar14 = -(uint)((float)local_a8._4_4_ < IVar22.Max.x);
    auVar17._0_4_ = ~uVar13 & local_a8._0_4_;
    auVar17._4_4_ = ~uVar14 & local_a8._4_4_;
    auVar17._8_4_ = ~uVar15 & (uint)fStack_a0;
    auVar17._12_4_ = ~uVar16 & (uint)fStack_9c;
    auVar7._4_4_ = (uint)IVar22.Max.x & uVar14;
    auVar7._0_4_ = (uint)IVar22.Max.y & uVar13;
    auVar7._8_4_ = (uint)IVar22.Min.y & uVar15;
    auVar7._12_4_ = (uint)IVar22.Min.x & uVar16;
    _local_a8 = auVar17 | auVar7;
  }
  IVar1 = (pIVar3->DC).CursorPos;
  fVar18 = local_a8._8_4_;
  fVar19 = local_a8._12_4_;
  local_98._8_4_ = fVar18;
  local_98._0_8_ = local_a8._8_8_;
  local_98._12_4_ = fVar19;
  local_88 = 0.125;
  fStack_84 = 0.125;
  uStack_80 = 0;
  uStack_7c = 0;
  local_78 = IVar1.x - fVar19 * 0.125;
  fStack_74 = IVar1.y - fVar18 * 0.125;
  fStack_70 = 0.0 - fVar18 * 0.0;
  fStack_6c = 0.0 - fVar19 * 0.0;
  local_c8 = pIVar8;
  lVar11 = 0;
  while (pIVar8 = GImGui, lVar11 < (int)uVar10) {
    pIVar12 = (local_c8->Viewports).Data[lVar11];
    local_c0 = pIVar3->DrawList;
    pIVar4 = GImGui->CurrentWindow;
    IVar1 = (pIVar12->super_ImGuiViewport).Pos;
    IVar2 = (pIVar12->super_ImGuiViewport).Size;
    fVar18 = IVar1.x;
    fVar21 = IVar1.y;
    local_f8.Min.x = fVar18 * 0.125 + local_78;
    local_f8.Min.y = fVar21 * 0.125 + fStack_74;
    fVar19 = (fVar18 + IVar2.x) * 0.125 + local_78;
    fVar21 = (fVar21 + IVar2.y) * 0.125 + fStack_74;
    auVar20._0_4_ = fVar19 - local_f8.Min.x;
    auVar20._4_4_ = fVar21 - local_f8.Min.y;
    auVar20._8_4_ = (fStack_70 + 0.0) - (fStack_70 + 0.0);
    auVar20._12_4_ = (fStack_6c + 0.0) - (fStack_6c + 0.0);
    auVar6._8_8_ = 0;
    auVar6._0_4_ = IVar2.x;
    auVar6._4_4_ = IVar2.y;
    local_58 = divps(auVar20,auVar6);
    IVar1 = (pIVar12->super_ImGuiViewport).Pos;
    local_68 = local_f8.Min.x - IVar1.x * local_58._0_4_;
    fStack_64 = local_f8.Min.y - IVar1.y * local_58._4_4_;
    fStack_60 = (fStack_70 + 0.0) - local_58._8_4_ * 0.0;
    fStack_5c = (fStack_6c + 0.0) - local_58._12_4_ * 0.0;
    fVar18 = *(float *)(&DAT_00200ca0 + (ulong)(-1 < (char)(pIVar12->super_ImGuiViewport).Flags) * 4
                       );
    pIVar5 = pIVar4->DrawList;
    local_f8.Max.x = fVar19;
    local_f8.Max.y = fVar21;
    local_b8 = lVar11;
    IVar9 = GetColorU32(5,fVar18 * 0.4);
    ImDrawList::AddRectFilled(pIVar5,&local_f8.Min,&local_f8.Max,IVar9,0.0,0xf);
    local_b0 = pIVar12;
    for (uVar10 = 0; uVar10 != (uint)(pIVar8->Windows).Size; uVar10 = uVar10 + 1) {
      this = (pIVar8->Windows).Data[uVar10];
      if (((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) &&
         (this->Viewport == pIVar12)) {
        IVar22 = ImGuiWindow::Rect(this);
        local_48._8_4_ = extraout_XMM0_Dc;
        local_48._0_4_ = IVar22.Min.x;
        local_48._4_4_ = IVar22.Min.y;
        local_48._12_4_ = extraout_XMM0_Dd;
        local_d8._8_4_ = fVar19;
        local_d8._0_4_ = IVar22.Max.x;
        local_d8._4_4_ = IVar22.Max.y;
        local_d8._12_4_ = fVar21;
        IVar22 = ImGuiWindow::TitleBarRect(this);
        thumb_r_scaled.Min.x =
             (float)(int)((float)local_48._0_4_ * (float)local_58._0_4_ + local_68);
        thumb_r_scaled.Min.y =
             (float)(int)((float)local_48._4_4_ * (float)local_58._4_4_ + fStack_64);
        thumb_r_scaled.Max.x =
             (float)(int)((float)local_d8._0_4_ * (float)local_58._0_4_ + local_68);
        thumb_r_scaled.Max.y =
             (float)(int)((float)local_d8._4_4_ * (float)local_58._4_4_ + fStack_64);
        local_e8.Min.x = (float)(int)(IVar22.Min.x * (float)local_58._0_4_ + local_68);
        local_e8.Min.y = (float)(int)(IVar22.Min.y * (float)local_58._4_4_ + fStack_64);
        local_e8.Max.x = (float)(int)(IVar22.Max.x * (float)local_58._0_4_ + local_68);
        local_e8.Max.y = local_e8.Min.y + 5.0;
        ImRect::ClipWithFull(&thumb_r_scaled,&local_f8);
        ImRect::ClipWithFull(&local_e8,&local_f8);
        uVar13 = 10;
        if (pIVar8->NavWindow != (ImGuiWindow *)0x0) {
          uVar13 = this->RootWindowForTitleBarHighlight ==
                   pIVar8->NavWindow->RootWindowForTitleBarHighlight | 10;
        }
        pIVar5 = pIVar4->DrawList;
        IVar9 = GetColorU32(2,fVar18);
        ImDrawList::AddRectFilled(pIVar5,&thumb_r_scaled.Min,&thumb_r_scaled.Max,IVar9,0.0,0xf);
        pIVar5 = pIVar4->DrawList;
        IVar9 = GetColorU32(uVar13,fVar18);
        ImDrawList::AddRectFilled(pIVar5,&local_e8.Min,&local_e8.Max,IVar9,0.0,0xf);
        pIVar5 = pIVar4->DrawList;
        IVar9 = GetColorU32(5,fVar18);
        fVar19 = 0.0;
        fVar21 = 0.0;
        ImDrawList::AddRect(pIVar5,&thumb_r_scaled.Min,&thumb_r_scaled.Max,IVar9,0.0,0xf,1.0);
        if ((this->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
           (this = this->DockNodeAsHost->VisibleWindow, pIVar12 = local_b0,
           this != (ImGuiWindow *)0x0)) {
          pIVar5 = pIVar4->DrawList;
          font = pIVar8->Font;
          local_d8._0_4_ = pIVar8->FontSize;
          IVar9 = GetColorU32(0,fVar18);
          text = this->Name;
          text_end = FindRenderedTextEnd(text,(char *)0x0);
          fVar19 = 0.0;
          fVar21 = 0.0;
          ImDrawList::AddText(pIVar5,font,(float)local_d8._0_4_,&local_e8.Min,IVar9,text,text_end,
                              0.0,(ImVec4 *)0x0);
          pIVar12 = local_b0;
        }
      }
    }
    IVar9 = GetColorU32(5,fVar18);
    ImDrawList::AddRect(local_c0,&local_f8.Min,&local_f8.Max,IVar9,0.0,0xf,1.0);
    uVar10 = (ulong)(uint)(local_c8->Viewports).Size;
    lVar11 = local_b8 + 1;
  }
  thumb_r_scaled.Min.y = ((float)local_a8._0_4_ - (float)local_98._0_4_) * fStack_84;
  thumb_r_scaled.Min.x = ((float)local_a8._4_4_ - (float)local_98._4_4_) * local_88;
  Dummy(&thumb_r_scaled.Min);
  return;
}

Assistant:

void ImGui::ShowViewportThumbnails()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We don't display full monitor bounds (we could, but it often looks awkward), instead we display just enough to cover all of our viewports.
    float SCALE = 1.0f / 8.0f;
    ImRect bb_full;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    bb_full.Add(GetPlatformMonitorMainRect(g.PlatformIO.Monitors[n]));
    for (int n = 0; n < g.Viewports.Size; n++)
        bb_full.Add(g.Viewports[n]->GetRect());
    ImVec2 p = window->DC.CursorPos;
    ImVec2 off = p - bb_full.Min * SCALE;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    window->DrawList->AddRect(off + g.PlatformIO.Monitors[n].MainPos * SCALE, off + (g.PlatformIO.Monitors[n].MainPos + g.PlatformIO.Monitors[n].MainSize) * SCALE, ImGui::GetColorU32(ImGuiCol_Border));
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImRect viewport_draw_bb(off + (viewport->Pos) * SCALE, off + (viewport->Pos + viewport->Size) * SCALE);
        RenderViewportThumbnail(window->DrawList, viewport, viewport_draw_bb);
    }
    ImGui::Dummy(bb_full.GetSize() * SCALE);
}